

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qual_hostname.c
# Opt level: O3

int get_self_ip_addr(void *cm,CMtrans_services_conflict svc)

{
  ushort uVar1;
  ushort *puVar2;
  CMTransport_trace p_Var3;
  long lVar4;
  short *psVar5;
  char *__s1;
  int iVar6;
  int iVar7;
  in_addr_t iVar8;
  hostent *phVar9;
  char **ppcVar10;
  void *__ptr;
  long *plVar11;
  uint uVar12;
  void *pvVar13;
  char *pcVar14;
  long *plVar15;
  uint uVar16;
  ulong uVar17;
  uint *__cp;
  ifaddrs *if_addrs;
  ifconf ifaces;
  char buf [46];
  char hostname_buf [256];
  long *local_180;
  int local_178 [2];
  void *local_170;
  char local_168 [48];
  char local_138 [264];
  
  local_180 = (long *)0x0;
  iVar6 = getifaddrs(&local_180);
  if (iVar6 == 0) {
    if (local_180 != (long *)0x0) {
      plVar11 = local_180;
      do {
        puVar2 = (ushort *)plVar11[3];
        if (puVar2 != (ushort *)0x0) {
          uVar1 = *puVar2;
          if ((uVar1 & 0xfff7) == 2 && svc != (CMtrans_services_conflict)0x0) {
            p_Var3 = svc->trace_out;
            lVar4 = plVar11[1];
            pcVar14 = inet_ntop((uint)uVar1,puVar2 + (ulong)(uVar1 != 2) * 2 + 2,local_168,0x2e);
            (*p_Var3)((CManager)cm,"CM<transport> IP possibility -> %s : %s",lVar4,pcVar14);
          }
        }
        plVar11 = (long *)*plVar11;
      } while (plVar11 != (long *)0x0);
    }
    pcVar14 = getenv("CM_INTERFACE");
    plVar15 = local_180;
    plVar11 = local_180;
    if (pcVar14 != (char *)0x0) {
      for (; plVar11 != (long *)0x0; plVar11 = (long *)*plVar11) {
        psVar5 = (short *)plVar11[3];
        if ((psVar5 != (short *)0x0) && (*psVar5 == 2)) {
          __s1 = (char *)plVar11[1];
          iVar6 = strcmp(__s1,pcVar14);
          if (iVar6 == 0) {
            __cp = (uint *)(psVar5 + 2);
            if (svc != (CMtrans_services_conflict)0x0) {
              p_Var3 = svc->trace_out;
              pcVar14 = inet_ntop(2,__cp,local_168,0x2e);
              (*p_Var3)((CManager)cm,"CM<transport> Interface specified, returning ->%s : %s",__s1,
                        pcVar14);
              plVar15 = local_180;
            }
            goto LAB_001032d6;
          }
        }
      }
      printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n"
             ,pcVar14);
    }
    gethostname(local_138,0x100);
    phVar9 = gethostbyname(local_138);
    if (phVar9 != (hostent *)0x0) {
      ppcVar10 = phVar9->h_addr_list;
      __cp = (uint *)*ppcVar10;
      while (__cp != (uint *)0x0) {
        ppcVar10 = ppcVar10 + 1;
        uVar16 = *__cp;
        if ((char)uVar16 != '\x7f') {
          plVar15 = local_180;
          if (svc != (CMtrans_services_conflict)0x0) {
            (*svc->trace_out)((CManager)cm,
                              "CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d",
                              (ulong)(uVar16 & 0xff),(ulong)(uVar16 >> 8 & 0xff),
                              (ulong)(uVar16 >> 0x10 & 0xff),(ulong)(uVar16 >> 0x18));
            plVar15 = local_180;
          }
LAB_001032d6:
          freeifaddrs(plVar15);
          goto LAB_001032db;
        }
        __cp = (uint *)*ppcVar10;
      }
    }
    plVar11 = local_180;
    if (local_180 == (long *)0x0) goto LAB_00102e66;
    do {
      psVar5 = (short *)plVar11[3];
      if (((psVar5 != (short *)0x0) && (*psVar5 == 2)) && ((*(byte *)(plVar11 + 2) & 8) == 0)) {
        if (svc != (CMtrans_services_conflict)0x0) {
          p_Var3 = svc->trace_out;
          lVar4 = plVar11[1];
          pcVar14 = inet_ntop(2,psVar5 + 2,local_168,0x2e);
          (*p_Var3)((CManager)cm,"CM<transport> get_self_ip_addr returning first avail -> %s : %s",
                    lVar4,pcVar14);
        }
        uVar16 = *(uint *)(psVar5 + 2);
        freeifaddrs(local_180);
        return uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
      }
      plVar11 = (long *)*plVar11;
    } while (plVar11 != (long *)0x0);
  }
  if (local_180 != (long *)0x0) {
    freeifaddrs(local_180);
  }
LAB_00102e66:
  gethostname(local_138,0x100);
  phVar9 = gethostbyname(local_138);
  if (phVar9 != (hostent *)0x0) {
    ppcVar10 = phVar9->h_addr_list;
    __cp = (uint *)*ppcVar10;
    while (__cp != (uint *)0x0) {
      ppcVar10 = ppcVar10 + 1;
      uVar16 = *__cp;
      uVar12 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
      if (uVar16 << 0x18 != 0x7f000000) {
        if (svc == (CMtrans_services_conflict)0x0) {
          return uVar12;
        }
        (*svc->trace_out)((CManager)cm,"CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",
                          (ulong)uVar12,(ulong)(uVar16 & 0xff),(ulong)(uVar16 >> 8 & 0xff),
                          (ulong)(uVar16 >> 0x10 & 0xff),uVar16 >> 0x18);
LAB_001032db:
        uVar16 = *__cp;
        return uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
      }
      __cp = (uint *)*ppcVar10;
    }
  }
  iVar6 = socket(2,2,0);
  local_178[0] = 0xa00;
  __ptr = malloc(0xa00);
  local_170 = __ptr;
  iVar7 = ioctl(iVar6,0x8912,local_178);
  iVar8 = 0;
  if ((-1 < iVar7) &&
     (uVar17 = (ulong)(long)local_178[0] / 0x28, pvVar13 = local_170, iVar8 = 0, (int)uVar17 != 0))
  {
    do {
      ioctl(iVar6,0x8913,pvVar13);
      uVar1 = *(ushort *)((long)pvVar13 + 0x10);
      if ((uVar1 & 8) == 0) {
        if ((uVar1 & 1) == 0) {
          pcVar14 = "CM<transport> - Get self IP addr %lx, rejected, not UP";
          goto LAB_00102f62;
        }
        if ((uVar1 & 0x40) == 0) {
          pcVar14 = "CM<transport> - Get self IP addr %lx, rejected, not RUNNING";
          goto LAB_00102f62;
        }
        uVar16 = *(uint *)((long)pvVar13 + 0x14);
        if ((uVar16 != 0) && (uVar16 != 0x7f000001)) {
          iVar8 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                  uVar16 << 0x18;
          if (svc != (CMtrans_services_conflict)0x0) {
            (*svc->trace_out)((CManager)cm,
                              "CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",
                              (ulong)iVar8,(ulong)(uVar16 & 0xff),(ulong)(uVar16 >> 8 & 0xff),
                              (ulong)(uVar16 >> 0x10 & 0xff),uVar16 >> 0x18);
          }
          goto LAB_00103140;
        }
      }
      else {
        pcVar14 = "CM<transport> - Get self IP addr %lx, rejected, loopback";
LAB_00102f62:
        if (svc != (CMtrans_services_conflict)0x0) {
          uVar16 = *(uint *)((long)pvVar13 + 0x14);
          (*svc->trace_out)((CManager)cm,pcVar14,
                            (ulong)(uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 |
                                    (uVar16 & 0xff00) << 8 | uVar16 << 0x18));
        }
      }
      uVar16 = (int)uVar17 - 1;
      uVar17 = (ulong)uVar16;
      pvVar13 = (void *)((long)pvVar13 + 0x28);
    } while (uVar16 != 0);
    iVar8 = 0;
  }
LAB_00103140:
  close(iVar6);
  free(__ptr);
  if (iVar8 == 0) {
    pcVar14 = getenv("CM_LAST_RESORT_IP_ADDR");
    if (svc == (CMtrans_services_conflict)0x0) {
      if (pcVar14 == (char *)0x0) {
        return 0;
      }
    }
    else {
      (*svc->trace_out)((CManager)cm,"CM<transport> - Get self IP addr at last resort");
      if (pcVar14 == (char *)0x0) {
        return 0;
      }
      (*svc->trace_out)((CManager)cm,"CM<transport> - Translating last resort %s",pcVar14);
    }
    iVar8 = inet_addr(pcVar14);
  }
  return iVar8;
}

Assistant:

static int
get_self_ip_addr(void *cm, CMtrans_services svc)
{
    struct hostent *host;
    char hostname_buf[256];
    char **p;
#ifdef HAVE_GETIFADDRS
  struct ifaddrs *if_addrs = NULL;
  struct ifaddrs *if_addr = NULL;
  void *tmp = NULL;
  char buf[INET6_ADDRSTRLEN];
#endif
#ifdef SIOCGIFCONF
    char *ifreqs;
    struct ifreq *ifr;
    struct sockaddr_in *sai;
    struct ifconf ifaces;
    int ifrn;
    int ss;
    int ipv4_count = 0;
    int ipv6_count = 0;
#endif
    int rv = 0;
#ifdef HAVE_GETIFADDRS
    if (getifaddrs(&if_addrs) == 0) {    
        char *interface;
	// Print possible addresses
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if ((family != AF_INET) && (family != AF_INET6)) continue;
	    if (if_addr->ifa_addr->sa_family == AF_INET) {
	        tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		ipv4_count++;
	    } else {
	        tmp = &((struct sockaddr_in6 *)if_addr->ifa_addr)->sin6_addr;
		ipv6_count++;
	    }
	    if (svc) {
	        svc->trace_out(cm, "CM<transport> IP possibility -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	}
	if ((interface = getenv("CM_INTERFACE")) != NULL) {
	    for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	        int family;
	        if (!if_addr->ifa_addr) continue;
		family = if_addr->ifa_addr->sa_family;
		if (family != AF_INET) continue;  /* currently not looking for ipv6 */
		if (strcmp(if_addr->ifa_name, interface) != 0) continue;
		tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		if (svc) {
		    svc->trace_out(cm, "CM<transport> Interface specified, returning ->%s : %s",
				   if_addr->ifa_name,
				   inet_ntop(family, tmp, buf, sizeof(buf)));
		}
		freeifaddrs(if_addrs);
		return (ntohl(*(uint32_t*)tmp));
	    }
	    printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n", interface);
	}
	    
	gethostname(hostname_buf, sizeof(hostname_buf));
	host = gethostbyname(hostname_buf);
	if (host != NULL) {
	    for (p = host->h_addr_list; *p != 0; p++) {
		struct in_addr *in = *(struct in_addr **) p;
		if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		    if (svc)
			svc->trace_out(cm, "CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d",
				       *((unsigned char *) &in->s_addr),
				       *(((unsigned char *) &in->s_addr) + 1),
				       *(((unsigned char *) &in->s_addr) + 2),
				       *(((unsigned char *) &in->s_addr) + 3));
		    freeifaddrs(if_addrs);
		    return (ntohl(in->s_addr));
		}
	    }
	}
	/* choose the first thing that's not a loopback interface */
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    uint32_t ret_ip;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if (family != AF_INET) continue;  /* currently not looking for ipv6 */
	    if ((if_addr->ifa_flags & IFF_LOOPBACK) != 0)  continue;
	    tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
	    if (svc) {
		svc->trace_out(cm, "CM<transport> get_self_ip_addr returning first avail -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	    ret_ip = (ntohl(*(uint32_t*)tmp));
	    freeifaddrs(if_addrs);
	    return ret_ip;
	}
    }
    if (if_addrs) freeifaddrs(if_addrs);
#endif	
    gethostname(hostname_buf, sizeof(hostname_buf));
    host = gethostbyname(hostname_buf);
    if (host != NULL) {
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",
				   ntohl(in->s_addr),
				   *((unsigned char *) &in->s_addr),
				   *(((unsigned char *) &in->s_addr) + 1),
				   *(((unsigned char *) &in->s_addr) + 2),
				   *(((unsigned char *) &in->s_addr) + 3));
		return (ntohl(in->s_addr));
	    }
	}
    }
    /*
     *  Since we couldn't find an IP address in some logical way, we'll open
     *  a DGRAM socket and ask it first for the list of its interfaces, and
     *  then checking for an interface we can use, and then finally asking that
     *  interface what its address is.
     */
#ifdef SIOCGIFCONF
    ss = socket(AF_INET, SOCK_DGRAM, 0);
    ifaces.ifc_len = 64 * sizeof(struct ifreq);
    ifaces.ifc_buf = ifreqs = malloc(ifaces.ifc_len);
    /*
     *  if we can't SIOCGIFCONF we're kind of dead anyway, bail.
     */
    if (ioctl(ss, SIOCGIFCONF, &ifaces) >= 0) {
	ifr = ifaces.ifc_req;
	ifrn = ifaces.ifc_len / sizeof(struct ifreq);
	for (; ifrn--; ifr++) {
	    /*
	     * Basically we'll take the first interface satisfying 
	     * the following: 
	     *   up, running, not loopback, address family is INET.
	     */
	    ioctl(ss, SIOCGIFFLAGS, ifr);
	    sai = (struct sockaddr_in *) &(ifr->ifr_addr);
	    if (ifr->ifr_flags & IFF_LOOPBACK) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, loopback",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_UP)) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, not UP",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_RUNNING)) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, not RUNNING",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    /*
	     * sure would be nice to test for AF_INET here but it doesn't
	     * cooperate and I've done enough for now ...
	     * if (sai->sin_addr.s.addr != AF_INET) continue;
	    */
	    if (sai->sin_addr.s_addr == INADDR_ANY)
		continue;
	    if (sai->sin_addr.s_addr == INADDR_LOOPBACK)
		continue;
	    rv = ntohl(sai->sin_addr.s_addr);
	    if (svc)
		svc->trace_out(cm, "CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",
			       ntohl(sai->sin_addr.s_addr),
			       *((unsigned char *) &sai->sin_addr.s_addr),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 1),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 2),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 3));
	    break;
	}
    }
    close(ss);
    free(ifreqs);
#endif
    /*
     *  Absolute last resort.  If we can't figure out anything else, look
     *  for the CM_LAST_RESORT_IP_ADDR environment variable.
     */
    if (rv == 0) {
	char *c = getenv("CM_LAST_RESORT_IP_ADDR");
	if (svc)
	    svc->trace_out(cm, "CM<transport> - Get self IP addr at last resort");
	if (c != NULL) {
	    if (svc)
		svc->trace_out(cm, "CM<transport> - Translating last resort %s", c);
	    rv = inet_addr(c);
	}
    }
    /*
     *	hopefully by now we've set rv to something useful.  If not,
     *  GET A BETTER NETWORK CONFIGURATION.
     */
    return rv;
}